

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O2

int Amap_LibDeriveGatePerm
              (Amap_Lib_t *pLib,Amap_Gat_t *pGate,Kit_DsdNtk_t *pNtk,Amap_Nod_t *pNod,char *pArray)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p;
  uint uVar5;
  uint uVar6;
  char cVar7;
  
  p = Amap_LibDeriveGatePerm_rec(pLib,pNtk,pNtk->Root & 0xfffffffe,pNod);
  if (p == (Vec_Int_t *)0x0) {
    iVar2 = 0;
  }
  else {
    uVar1 = p->nSize;
    if (uVar1 != (byte)pNod->field_0x2) {
      __assert_fail("Vec_IntSize(vPerm) == (int)pNod->nSuppSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapPerm.c"
                    ,0x156,
                    "int Amap_LibDeriveGatePerm(Amap_Lib_t *, Amap_Gat_t *, Kit_DsdNtk_t *, Amap_Nod_t *, char *)"
                   );
    }
    uVar5 = 0;
    while (uVar5 != uVar1) {
      iVar2 = Vec_IntEntry(p,uVar5);
      uVar5 = uVar5 + 1;
      uVar6 = uVar5;
      while ((int)uVar6 < (int)uVar1) {
        iVar3 = Vec_IntEntry(p,uVar6);
        iVar4 = Abc_Lit2Var(iVar2);
        iVar3 = Abc_Lit2Var(iVar3);
        uVar6 = uVar6 + 1;
        if (iVar4 == iVar3) {
          iVar2 = 0;
          goto LAB_006f3260;
        }
      }
    }
    cVar7 = '\0';
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      iVar2 = Vec_IntEntry(p,uVar5);
      if (SBORROW4(iVar2,(uint)(byte)pNod->field_0x2 * 2) ==
          (int)(iVar2 + (uint)(byte)pNod->field_0x2 * -2) < 0) {
        __assert_fail("Entry < 2 * (int)pNod->nSuppSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapPerm.c"
                      ,0x162,
                      "int Amap_LibDeriveGatePerm(Amap_Lib_t *, Amap_Gat_t *, Kit_DsdNtk_t *, Amap_Nod_t *, char *)"
                     );
      }
      iVar3 = Abc_LitIsCompl(iVar2);
      uVar6 = Abc_Lit2Var(iVar2);
      pArray[uVar6] = (char)iVar3 + cVar7;
      cVar7 = cVar7 + '\x02';
    }
    iVar2 = 1;
LAB_006f3260:
    Vec_IntFree(p);
  }
  return iVar2;
}

Assistant:

int Amap_LibDeriveGatePerm( Amap_Lib_t * pLib, Amap_Gat_t * pGate, Kit_DsdNtk_t * pNtk, Amap_Nod_t * pNod, char * pArray )
{
    int fVerbose = 0;
    Vec_Int_t * vPerm;
    int Entry, Entry2, i, k;
//    Kit_DsdPrint( stdout, pNtk );

    vPerm = Amap_LibDeriveGatePerm_rec( pLib, pNtk, Abc_LitRegular(pNtk->Root), pNod );
    if ( vPerm == NULL )
        return 0;
    // check that the permutation is valid
    assert( Vec_IntSize(vPerm) == (int)pNod->nSuppSize );
    Vec_IntForEachEntry( vPerm, Entry, i )
        Vec_IntForEachEntryStart( vPerm, Entry2, k, i+1 )
            if ( Abc_Lit2Var(Entry) == Abc_Lit2Var(Entry2) )
            {
                Vec_IntFree( vPerm );
                return 0;
            }

    // reverse the permutation
    Vec_IntForEachEntry( vPerm, Entry, i )
    {
        assert( Entry < 2 * (int)pNod->nSuppSize );
        pArray[Abc_Lit2Var(Entry)] = Abc_Var2Lit( i, Abc_LitIsCompl(Entry) );
//        pArray[i] = Entry;
//printf( "%d=%d%c ", Abc_Lit2Var(Entry), i, Abc_LitIsCompl(Entry)?'-':'+' );
    }
//printf( "\n" );
//    if ( Kit_DsdNonDsdSizeMax(pNtk) < 3 )
//        Amap_LibVerifyPerm( pLib, pGate, pNtk, pNod, Vec_IntArray(vPerm) );
    Vec_IntFree( vPerm );
    // print the result
    if ( fVerbose )
    {
    printf( "node %4d : ", pNod->Id );
    for ( i = 0; i < (int)pNod->nSuppSize; i++ )
        printf( "%d=%d%c ", i, Abc_Lit2Var(pArray[i]), Abc_LitIsCompl(pArray[i])?'-':'+' );
    printf( "\n" );
    }
    return 1;
}